

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
CompilerContext::compile_switch_withop
          (CompilerContext *this,SyntaxTree *swnode,
          vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *cases,
          shared_ptr<Label> *break_ptr)

{
  ulong uVar1;
  int iVar2;
  pointer pCVar3;
  Case *rhs;
  Command *command;
  pointer ppCVar4;
  pointer ppCVar5;
  bool bVar6;
  uint uVar7;
  SwitchAnnotation *pSVar8;
  Command *pCVar9;
  Command *pCVar10;
  pointer pCVar11;
  ulong uVar12;
  shared_ptr<Label> *__args;
  long lVar13;
  int *piVar14;
  pointer ppCVar15;
  Case *this_00;
  shared_ptr<Label> *__args_00;
  Case *c;
  long lVar16;
  __normal_iterator<CompilerContext::Case_**,_std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>_>
  __i;
  bool bVar17;
  pointer pLStack_130;
  vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> sorted_cases;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *__range1;
  Case *local_f0;
  undefined1 local_d0 [48];
  pointer local_a0;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  args;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_48;
  
  sorted_cases.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_cases.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sorted_cases.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::resize
            (&sorted_cases,
             ((long)(cases->
                    super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(cases->
                   super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38);
  pSVar8 = linb::any_cast<SwitchAnnotation_const&>(&swnode->udata);
  bVar6 = pSVar8->has_default;
  pCVar9 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_start);
  pCVar10 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_continued);
  ppCVar5 = sorted_cases.
            super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar4 = sorted_cases.
            super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (cases->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppCVar15 = sorted_cases.
             super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (pCVar11 = (cases->
                 super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar11 != pCVar3; pCVar11 = pCVar11 + 1)
  {
    *ppCVar15 = pCVar11;
    ppCVar15 = ppCVar15 + 1;
  }
  if (sorted_cases.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sorted_cases.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar16 = (long)sorted_cases.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)sorted_cases.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = lVar16 >> 3;
    lVar13 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
              (sorted_cases.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               sorted_cases.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar16 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
                (ppCVar4,ppCVar5);
    }
    else {
      ppCVar15 = ppCVar4 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
                (ppCVar4,ppCVar15);
      for (; ppCVar15 != ppCVar5; ppCVar15 = ppCVar15 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,__gnu_cxx::__ops::_Val_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
                  (ppCVar15);
      }
    }
  }
  if (bVar6 == false) {
    local_f0 = (Case *)0x0;
  }
  else {
    local_f0 = sorted_cases.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
    sorted_cases.
    super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         sorted_cases.
         super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    if ((local_f0->value).super_OptionalBase<int>.init_ == true) {
      __assert_fail("case_default->is_default()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp"
                    ,0x17c,
                    "void CompilerContext::compile_switch_withop(const SyntaxTree &, std::vector<Case> &, shared_ptr<Label>)"
                   );
    }
  }
  pCVar3 = (cases->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar11 = (cases->
                 super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar11 != pCVar3; pCVar11 = pCVar11 + 1)
  {
    make_internal_label((CompilerContext *)local_d0);
    std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pCVar11->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  }
  __args = &local_f0->target;
  if (bVar6 == false) {
    __args = break_ptr;
  }
  uVar12 = 0;
  do {
    if ((ulong)((long)sorted_cases.
                      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)sorted_cases.
                      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar12) {
      this_00 = (cases->
                super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
                _M_impl.super__Vector_impl_data._M_start;
      while (rhs = this_00, this_00 = rhs + 1,
            rhs != (cases->
                   super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
        std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_58,&(rhs->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
        std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
                  ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,
                   (shared_ptr<Label> *)&local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
        if ((this_00 ==
             (cases->
             super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
             _M_impl.super__Vector_impl_data._M_finish) ||
           (bVar6 = Case::same_body_as(this_00,rhs), !bVar6)) {
          compile_statements(this,(swnode->childs).
                                  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                  super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             rhs->first_statement_id,rhs->last_statement_id);
        }
      }
      std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,&break_ptr->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
      std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
                ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,
                 (shared_ptr<Label> *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      std::_Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::
      ~_Vector_base(&sorted_cases.
                     super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   );
      return;
    }
    args.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    args.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::reserve(&args,0x12);
    command = pCVar10;
    if (uVar12 == 0) {
      get_arg((ArgVariant *)local_d0,this,
              (((swnode->childs).
                super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::
      emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&args,(ArgVariant *)local_d0);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                   *)local_d0);
      lVar13 = (long)sorted_cases.
                     super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)sorted_cases.
                     super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar7 = (uint)lVar13;
      if ((int)uVar7 < -0x80) {
        if (uVar7 < 0xffff8000) {
LAB_001969b7:
          pLStack_130 = (pointer)0x4;
          local_d0._0_4_ = uVar7;
        }
        else {
LAB_001969cb:
          local_d0._0_2_ = (short)lVar13;
          pLStack_130 = (pointer)0x3;
        }
      }
      else {
        if (0x7f < (int)uVar7) {
          if (uVar7 < 0x8000) goto LAB_001969cb;
          goto LAB_001969b7;
        }
        local_d0[0] = (char)lVar13;
        pLStack_130 = (pointer)0x2;
      }
      local_a0 = pLStack_130;
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::
      emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&args,(ArgVariant *)local_d0);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                   *)local_d0);
      local_d0[0] = bVar6;
      local_a0 = (pointer)0x2;
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::
      emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&args,(ArgVariant *)local_d0);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
      ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                   *)local_d0);
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::emplace_back<std::shared_ptr<Label>const&>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&args,__args);
      command = pCVar9;
    }
    lVar13 = (ulong)(uVar12 != 0) * 2 + 7;
    uVar1 = lVar13 + uVar12;
    while (bVar17 = lVar13 != 0, lVar13 = lVar13 + -1, bVar17) {
      if (uVar12 < (ulong)((long)sorted_cases.
                                 super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sorted_cases.
                                 super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        piVar14 = std::experimental::optional<int>::operator*
                            (&sorted_cases.
                              super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar12]->value);
        iVar2 = *piVar14;
        if ((char)iVar2 == iVar2) {
          local_d0[0] = (char)iVar2;
          pLStack_130 = (pointer)0x2;
        }
        else if ((short)iVar2 == iVar2) {
          local_d0._0_2_ = (short)iVar2;
          pLStack_130 = (pointer)0x3;
        }
        else {
          pLStack_130 = (pointer)0x4;
          local_d0._0_4_ = iVar2;
        }
        local_a0 = pLStack_130;
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&args,(ArgVariant *)local_d0);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                     *)local_d0);
        __args_00 = &sorted_cases.
                     super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12]->target;
      }
      else {
        local_d0[0] = 0xff;
        local_a0 = (pointer)0x2;
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&args,(ArgVariant *)local_d0);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                     *)local_d0);
        __args_00 = break_ptr;
      }
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::emplace_back<std::shared_ptr<Label>&>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&args,__args_00);
      uVar12 = uVar12 + 1;
    }
    local_48.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         args.
         super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         args.
         super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         args.
         super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    args.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    args.
    super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    compile_command(this,command,&local_48,false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(&local_48);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(&args);
    uVar12 = uVar1;
  } while( true );
}

Assistant:

void CompilerContext::compile_switch_withop(const SyntaxTree& swnode, std::vector<Case>& cases, shared_ptr<Label> break_ptr)
{
    std::vector<Case*> sorted_cases;   // does not contain default, unlike `cases`
    sorted_cases.resize(cases.size());
    bool has_default = swnode.annotation<const SwitchAnnotation&>().has_default;
    const Case* case_default = nullptr;

    const Command& switch_start     = this->commands.switch_start.value();
    const Command& switch_continued = this->commands.switch_continued.value();

    std::transform(cases.begin(), cases.end(), sorted_cases.begin(), [] (auto& c) { return std::addressof<Case>(c); });

    std::sort(sorted_cases.begin(), sorted_cases.end(), [](const Case* a, const Case* b) {
        if(a->is_default()) return false; // default should be the last
        if(b->is_default()) return true;  // !a->is_default() == true
        return *a->value < *b->value;
    });

    if(has_default)
    {
        case_default = sorted_cases.back();
        sorted_cases.pop_back();
        assert(case_default->is_default());
    }

    for(auto& c : cases)
        c.target = make_internal_label();

    for(size_t i = 0; i < sorted_cases.size(); )
    {
        std::vector<ArgVariant> args;
        args.reserve(18);

        const Command& switch_op = (i == 0? switch_start : switch_continued);
        size_t max_cases_here    = (i == 0? 7 : 9);

        if(i == 0)
        {
            args.emplace_back(get_arg(swnode.child(0)));
            args.emplace_back(conv_int(sorted_cases.size()));
            args.emplace_back(conv_int(has_default));
            args.emplace_back(has_default? case_default->target : break_ptr);
        }

        for(size_t k = 0; k < max_cases_here; ++k, ++i)
        {
            if(i < sorted_cases.size())
            {
                args.emplace_back(conv_int(*sorted_cases[i]->value));
                args.emplace_back(sorted_cases[i]->target);
            }
            else
            {
                args.emplace_back(conv_int(-1));
                args.emplace_back(break_ptr);
            }
        }

        compile_command(switch_op, std::move(args));
    }

    for(auto it = cases.begin(); it != cases.end(); ++it)
    {
        compile_label(it->target);
        if(std::next(it) == cases.end() || !std::next(it)->same_body_as(*it))
        {
            compile_statements(swnode.child(1), it->first_statement_id, it->last_statement_id);
        }
    }

    compile_label(break_ptr);
}